

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelativeWorldCoordinates.cpp
# Opt level: O3

KBOOL __thiscall
KDIS::DATA_TYPE::RelativeWorldCoordinates::operator==
          (RelativeWorldCoordinates *this,RelativeWorldCoordinates *Value)

{
  KBOOL KVar1;
  KFIXED<short,_(unsigned_char)__x03_> local_58;
  KFIXED<short,_(unsigned_char)__x03_> local_48;
  KFIXED<short,_(unsigned_char)__x03_> local_38;
  
  if (this->m_ui16RefPnt == Value->m_ui16RefPnt) {
    local_38.super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00222bd0;
    local_38.m_Val = (Value->m_DelX).m_Val;
    KVar1 = KFIXED<short,_(unsigned_char)'\x03'>::operator!=(&this->m_DelX,&local_38);
    DataTypeBase::~DataTypeBase(&local_38.super_DataTypeBase);
    if (!KVar1) {
      local_48.super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00222bd0;
      local_48.m_Val = (Value->m_DelY).m_Val;
      KVar1 = KFIXED<short,_(unsigned_char)'\x03'>::operator!=(&this->m_DelY,&local_48);
      DataTypeBase::~DataTypeBase(&local_48.super_DataTypeBase);
      if (!KVar1) {
        local_58.super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00222bd0;
        local_58.m_Val = (Value->m_DelZ).m_Val;
        KVar1 = KFIXED<short,_(unsigned_char)'\x03'>::operator!=(&this->m_DelZ,&local_58);
        DataTypeBase::~DataTypeBase(&local_58.super_DataTypeBase);
        return !KVar1;
      }
    }
  }
  return false;
}

Assistant:

KBOOL RelativeWorldCoordinates::operator == ( const RelativeWorldCoordinates  & Value ) const
{
    if( m_ui16RefPnt != Value.m_ui16RefPnt ) return false;
    if( m_DelX       != Value.m_DelX )       return false;
    if( m_DelY       != Value.m_DelY )       return false;
    if( m_DelZ       != Value.m_DelZ )       return false;
    return true;
}